

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O0

void __thiscall DFraggleThinker::DFraggleThinker(DFraggleThinker *this)

{
  DFraggleThinker *pDVar1;
  DRunningScript *pDVar2;
  DFsScript *pDVar3;
  DFsScript *pDVar4;
  DFraggleThinker *this_local;
  
  DThinker::DThinker(&this->super_DThinker,0x67);
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_00a09688;
  TObjPtr<DFsScript>::TObjPtr(&this->LevelScript);
  TObjPtr<DRunningScript>::TObjPtr(&this->RunningScripts);
  TArray<TObjPtr<AActor>,_TObjPtr<AActor>_>::TArray(&this->SpawnedThings);
  pDVar1 = ::TObjPtr::operator_cast_to_DFraggleThinker_((TObjPtr *)&ActiveThinker);
  if (pDVar1 == (DFraggleThinker *)0x0) {
    pDVar1 = this;
    TObjPtr<DFraggleThinker>::operator=(&ActiveThinker,this);
    pDVar2 = (DRunningScript *)DObject::operator_new((DObject *)0xd8,(size_t)pDVar1);
    DRunningScript::DRunningScript(pDVar2,(AActor *)0x0,(DFsScript *)0x0,0);
    TObjPtr<DRunningScript>::operator=(&this->RunningScripts,pDVar2);
    pDVar3 = (DFsScript *)DObject::operator_new((DObject *)0x960,(size_t)pDVar2);
    DFsScript::DFsScript(pDVar3);
    TObjPtr<DFsScript>::operator=(&this->LevelScript,pDVar3);
    pDVar3 = global_script;
    pDVar4 = TObjPtr<DFsScript>::operator->(&this->LevelScript);
    TObjPtr<DFsScript>::operator=(&pDVar4->parent,pDVar3);
    pDVar2 = ::TObjPtr::operator_cast_to_DRunningScript_((TObjPtr *)&this->RunningScripts);
    GC::WriteBarrier((DObject *)this,&pDVar2->super_DObject);
    pDVar3 = ::TObjPtr::operator_cast_to_DFsScript_((TObjPtr *)&this->LevelScript);
    GC::WriteBarrier((DObject *)this,&pDVar3->super_DObject);
    this->nocheckposition = false;
  }
  else {
    I_Error("Only one FraggleThinker is allowed to exist at a time.\nCheck your code.");
  }
  return;
}

Assistant:

DFraggleThinker::DFraggleThinker() 
: DThinker(STAT_SCRIPTS)
{
	if (ActiveThinker)
	{
		I_Error ("Only one FraggleThinker is allowed to exist at a time.\nCheck your code.");
	}
	else
	{
		ActiveThinker = this;
		RunningScripts = new DRunningScript;
		LevelScript = new DFsScript;
		LevelScript->parent = global_script;
		GC::WriteBarrier(this, RunningScripts);
		GC::WriteBarrier(this, LevelScript);
		nocheckposition = false;
	}
}